

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall QTableModel::removeRows(QTableModel *this,int row,int count,QModelIndex *param_4)

{
  QTableWidgetItem *pQVar1;
  int iVar2;
  qsizetype qVar3;
  long lVar4;
  const_reference ppQVar5;
  int *piVar6;
  int in_EDX;
  int in_ESI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int v;
  int j;
  QTableWidgetItem *oldItem;
  int n;
  int i;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  int local_78;
  int local_74;
  bool local_45;
  int local_44;
  undefined1 local_40 [28];
  int local_24;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_EDX < 1) || (in_ESI < 0)) ||
     (qVar3 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x30)),
     qVar3 < in_ESI + in_EDX)) {
    local_45 = false;
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x8d4207);
    QAbstractItemModel::beginRemoveRows(in_RDI,(int)local_20,in_ESI);
    lVar4 = tableIndex((QTableModel *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    local_24 = (int)lVar4;
    QModelIndex::QModelIndex((QModelIndex *)0x8d4251);
    iVar2 = (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,local_40);
    for (local_74 = local_24; local_74 < in_EDX * iVar2 + local_24; local_74 = local_74 + 1) {
      ppQVar5 = QList<QTableWidgetItem_*>::at
                          ((QList<QTableWidgetItem_*> *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pQVar1 = *ppQVar5;
      if (pQVar1 != (QTableWidgetItem *)0x0) {
        pQVar1->view = (QTableWidget *)0x0;
        (*pQVar1->_vptr_QTableWidgetItem[1])();
      }
    }
    local_44 = 0;
    piVar6 = qMax<int>(&local_24,&local_44);
    QList<QTableWidgetItem_*>::remove
              ((QList<QTableWidgetItem_*> *)(in_RDI + 0x18),(char *)(long)*piVar6);
    for (local_78 = in_ESI; local_78 < in_ESI + in_EDX; local_78 = local_78 + 1) {
      ppQVar5 = QList<QTableWidgetItem_*>::at
                          ((QList<QTableWidgetItem_*> *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pQVar1 = *ppQVar5;
      if (pQVar1 != (QTableWidgetItem *)0x0) {
        pQVar1->view = (QTableWidget *)0x0;
        (*pQVar1->_vptr_QTableWidgetItem[1])();
      }
    }
    QList<QTableWidgetItem_*>::remove
              ((QList<QTableWidgetItem_*> *)(in_RDI + 0x30),(char *)(long)in_ESI);
    QAbstractItemModel::endRemoveRows();
    local_45 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_45;
}

Assistant:

bool QTableModel::removeRows(int row, int count, const QModelIndex &)
{
    if (count < 1 || row < 0 || row + count > verticalHeaderItems.size())
        return false;

    beginRemoveRows(QModelIndex(), row, row + count - 1);
    int i = tableIndex(row, 0);
    int n = count * columnCount();
    QTableWidgetItem *oldItem = nullptr;
    for (int j = i; j < n + i; ++j) {
        oldItem = tableItems.at(j);
        if (oldItem)
            oldItem->view = nullptr;
        delete oldItem;
    }
    tableItems.remove(qMax(i, 0), n);
    for (int v = row; v < row + count; ++v) {
        oldItem = verticalHeaderItems.at(v);
        if (oldItem)
            oldItem->view = nullptr;
        delete oldItem;
    }
    verticalHeaderItems.remove(row, count);
    endRemoveRows();
    return true;
}